

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uni_ringbuf.c
# Opt level: O2

RingBufferHandle RingBufferCreate(int size)

{
  uint *puVar1;
  void *pvVar2;
  RingBuf *buf;
  
  if (size < 1) {
    puVar1 = (uint *)0x0;
  }
  else {
    puVar1 = (uint *)malloc(0x18);
    *puVar1 = size + 1U;
    pvVar2 = malloc((ulong)(size + 1U));
    *(void **)(puVar1 + 2) = pvVar2;
    puVar1[4] = 0;
    puVar1[5] = 0;
  }
  return puVar1;
}

Assistant:

RingBufferHandle RingBufferCreate(int size) {
  RingBuf *ring_buf;
  if (size <= 0) {
    return (RingBufferHandle)NULL;
  }
  ring_buf = _create_ring_buf();
  _init_ring_buf(ring_buf, size);
  return (RingBufferHandle)ring_buf;
}